

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::Int64Range::SerializeWithCachedSizes
          (Int64Range *this,CodedOutputStream *output)

{
  if (this->minvalue_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->minvalue_,output);
  }
  if (this->maxvalue_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(2,this->maxvalue_,output);
    return;
  }
  return;
}

Assistant:

void Int64Range::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Int64Range)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 minValue = 1;
  if (this->minvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->minvalue(), output);
  }

  // int64 maxValue = 2;
  if (this->maxvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->maxvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Int64Range)
}